

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::ErrorExit<unsigned_long&,int>(FileLoc *loc,char *fmt,unsigned_long *args,int *args_1)

{
  int *in_R8;
  string local_30;
  
  StringPrintf<unsigned_long&,int>(&local_30,(pbrt *)fmt,(char *)args,(unsigned_long *)args_1,in_R8)
  ;
  ErrorExit(loc,local_30._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const FileLoc *loc, const char *fmt, Args &&... args) {
    ErrorExit(loc, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}